

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O1

int Res_WinCollectLeavesAndNodes(Res_Win_t *p)

{
  Vec_Vec_t *p_00;
  Abc_Ntk_t *pAVar1;
  void *pvVar2;
  long *plVar3;
  long *Entry;
  long lVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  bool bVar8;
  int *piVar9;
  void **ppvVar10;
  uint uVar11;
  int iVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  ulong uVar13;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  
  if (p->nWinTfiMax < 1) {
    __assert_fail("p->nWinTfiMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x6a,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
  }
  p_00 = p->vMatrix;
  uVar11 = p_00->nSize;
  if ((int)uVar11 <= p->nWinTfiMax) {
    __assert_fail("Vec_VecSize(p->vMatrix) > p->nWinTfiMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x6b,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
  }
  if (0 < (int)uVar11) {
    ppvVar10 = p_00->pArray;
    uVar13 = 0;
    do {
      *(undefined4 *)((long)ppvVar10[uVar13] + 4) = 0;
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  Vec_VecPush(p_00,0,p->pNode);
  pAVar1 = p->pNode->pNtk;
  iVar15 = extraout_EDX;
  if ((pAVar1->vTravIds).pArray == (int *)0x0) {
    iVar12 = pAVar1->vObjs->nSize;
    uVar13 = (long)iVar12 + 500;
    iVar18 = (int)uVar13;
    if ((pAVar1->vTravIds).nCap < iVar18) {
      piVar9 = (int *)malloc(uVar13 * 4);
      (pAVar1->vTravIds).pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar1->vTravIds).nCap = iVar18;
      iVar15 = extraout_EDX_00;
    }
    if (-500 < iVar12) {
      memset((pAVar1->vTravIds).pArray,0,(uVar13 & 0xffffffff) << 2);
      iVar15 = extraout_EDX_01;
    }
    (pAVar1->vTravIds).nSize = iVar18;
  }
  iVar12 = pAVar1->nTravIds;
  pAVar1->nTravIds = iVar12 + 1;
  if (0x3ffffffe < iVar12) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pAVar1 = p->pNode->pNtk;
  iVar12 = pAVar1->nTravIds;
  iVar18 = p->pNode->Id;
  Vec_IntFillExtra(&pAVar1->vTravIds,iVar18 + 1,iVar15);
  if (((long)iVar18 < 0) || ((pAVar1->vTravIds).nSize <= iVar18)) {
LAB_00468958:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar1->vTravIds).pArray[iVar18] = iVar12;
  p->vLeaves->nSize = 0;
  uVar11 = p->nWinTfiMax;
  if (-1 < (int)uVar11) {
    lVar17 = 0;
    do {
      if (p->vMatrix->nSize <= lVar17) goto LAB_00468977;
      pvVar2 = p->vMatrix->pArray[lVar17];
      if (0 < *(int *)((long)pvVar2 + 4)) {
        uVar13 = 0;
        do {
          plVar3 = *(long **)(*(long *)((long)pvVar2 + 8) + uVar13 * 8);
          if (0 < *(int *)((long)plVar3 + 0x1c)) {
            lVar19 = 0;
            uVar14 = uVar13;
            do {
              Entry = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                (long)*(int *)(plVar3[4] + lVar19 * 4) * 8);
              lVar4 = *Entry;
              iVar15 = (int)Entry[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar15 + 1,(int)uVar14);
              if (((long)iVar15 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar15)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              lVar5 = *Entry;
              iVar12 = *(int *)(lVar5 + 0xd8);
              uVar14 = extraout_RDX;
              if (*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar15 * 4) != iVar12) {
                iVar15 = (int)Entry[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar15 + 1,(int)extraout_RDX);
                if (((long)iVar15 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar15)) goto LAB_00468958;
                *(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar15 * 4) = iVar12;
                uVar11 = *(uint *)((long)Entry + 0x14) & 0xf;
                if ((uVar11 != 2) && (uVar11 != 5)) {
                  iVar15 = (*(uint *)&p->pNode->field_0x14 >> 0xc) -
                           (*(uint *)((long)Entry + 0x14) >> 0xc);
                  if (iVar15 <= p->nWinTfiMax) {
                    Vec_VecPush(p->vMatrix,iVar15,Entry);
                    uVar14 = extraout_RDX_00;
                    goto LAB_00468762;
                  }
                }
                pVVar6 = p->vLeaves;
                uVar11 = pVVar6->nCap;
                if (pVVar6->nSize == uVar11) {
                  if ((int)uVar11 < 0x10) {
                    if (pVVar6->pArray == (void **)0x0) {
                      ppvVar10 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar10 = (void **)realloc(pVVar6->pArray,0x80);
                    }
                    pVVar6->pArray = ppvVar10;
                    iVar15 = 0x10;
                  }
                  else {
                    iVar15 = uVar11 * 2;
                    if (iVar15 <= (int)uVar11) goto LAB_0046874c;
                    if (pVVar6->pArray == (void **)0x0) {
                      ppvVar10 = (void **)malloc((ulong)uVar11 << 4);
                    }
                    else {
                      ppvVar10 = (void **)realloc(pVVar6->pArray,(ulong)uVar11 << 4);
                    }
                    pVVar6->pArray = ppvVar10;
                  }
                  pVVar6->nCap = iVar15;
                }
LAB_0046874c:
                iVar15 = pVVar6->nSize;
                uVar11 = iVar15 + 1;
                uVar14 = (ulong)uVar11;
                pVVar6->nSize = uVar11;
                pVVar6->pArray[iVar15] = Entry;
              }
LAB_00468762:
              lVar19 = lVar19 + 1;
            } while (lVar19 < *(int *)((long)plVar3 + 0x1c));
          }
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)*(int *)((long)pvVar2 + 4));
      }
      uVar11 = p->nWinTfiMax;
      bVar8 = lVar17 < (int)uVar11;
      lVar17 = lVar17 + 1;
    } while (bVar8);
  }
  if (p->vLeaves->nSize == 0) {
    iVar15 = 0;
  }
  else {
    p->vNodes->nSize = 0;
    if (-1 < (int)uVar11) {
      uVar13 = (ulong)uVar11;
      do {
        if ((long)p->vMatrix->nSize <= (long)uVar13) {
LAB_00468977:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        pvVar2 = p->vMatrix->pArray[uVar13];
        if (0 < *(int *)((long)pvVar2 + 4)) {
          lVar17 = 0;
          do {
            pvVar7 = *(void **)(*(long *)((long)pvVar2 + 8) + lVar17 * 8);
            pVVar6 = p->vNodes;
            uVar11 = pVVar6->nCap;
            if (pVVar6->nSize == uVar11) {
              if ((int)uVar11 < 0x10) {
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc(0x80);
                }
                else {
                  ppvVar10 = (void **)realloc(pVVar6->pArray,0x80);
                }
                pVVar6->pArray = ppvVar10;
                iVar15 = 0x10;
              }
              else {
                iVar15 = uVar11 * 2;
                if (iVar15 <= (int)uVar11) goto LAB_00468867;
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc((ulong)uVar11 << 4);
                }
                else {
                  ppvVar10 = (void **)realloc(pVVar6->pArray,(ulong)uVar11 << 4);
                }
                pVVar6->pArray = ppvVar10;
              }
              pVVar6->nCap = iVar15;
            }
LAB_00468867:
            iVar15 = pVVar6->nSize;
            pVVar6->nSize = iVar15 + 1;
            pVVar6->pArray[iVar15] = pvVar7;
            lVar17 = lVar17 + 1;
          } while (lVar17 < *(int *)((long)pvVar2 + 4));
        }
        *(undefined4 *)((long)pvVar2 + 4) = 0;
        bVar8 = 0 < (long)uVar13;
        uVar13 = uVar13 - 1;
      } while (bVar8);
    }
    p->nLevLeafMin = 1000000000;
    lVar17 = (long)p->vLeaves->nSize;
    if (0 < lVar17) {
      ppvVar10 = p->vLeaves->pArray;
      uVar11 = p->nLevLeafMin;
      lVar19 = 0;
      do {
        uVar16 = *(uint *)((long)ppvVar10[lVar19] + 0x14) >> 0xc;
        if ((int)uVar16 <= (int)uVar11) {
          uVar11 = uVar16;
        }
        p->nLevLeafMin = uVar11;
        lVar19 = lVar19 + 1;
      } while (lVar17 != lVar19);
    }
    iVar12 = (*(uint *)&p->pNode->field_0x14 >> 0xc) - (p->nWinTfiMax + p->nLevTfiMinus);
    if (iVar12 <= p->nLevLeafMin) {
      iVar12 = p->nLevLeafMin;
    }
    p->nLevTravMin = iVar12;
    iVar15 = 1;
    if (iVar12 < 0) {
      __assert_fail("p->nLevTravMin >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                    ,0x98,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
    }
  }
  return iVar15;
}

Assistant:

int Res_WinCollectLeavesAndNodes( Res_Win_t * p )
{
    Vec_Ptr_t * vFront;
    Abc_Obj_t * pObj, * pTemp;
    int i, k, m;

    assert( p->nWinTfiMax > 0 );
    assert( Vec_VecSize(p->vMatrix) > p->nWinTfiMax );

    // start matrix with the node
    Vec_VecClear( p->vMatrix );
    Vec_VecPush( p->vMatrix, 0, p->pNode );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Abc_NodeSetTravIdCurrent( p->pNode );

    // collect the leaves (nodes pTemp such that "p->pNode->Level - pTemp->Level > p->nWinTfiMax")
    Vec_PtrClear( p->vLeaves );
    Vec_VecForEachLevelStartStop( p->vMatrix, vFront, i, 0, p->nWinTfiMax+1 )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, k )
        {
            Abc_ObjForEachFanin( pObj, pTemp, m )
            {
                if ( Abc_NodeIsTravIdCurrent( pTemp ) )
                    continue;
                Abc_NodeSetTravIdCurrent( pTemp );
                if ( Abc_ObjIsCi(pTemp) || (int)(p->pNode->Level - pTemp->Level) > p->nWinTfiMax )                    
                    Vec_PtrPush( p->vLeaves, pTemp );
                else
                    Vec_VecPush( p->vMatrix, p->pNode->Level - pTemp->Level, pTemp );
            }
        }
    }
    if ( Vec_PtrSize(p->vLeaves) == 0 )
        return 0;

    // collect the nodes in the reverse order
    Vec_PtrClear( p->vNodes );
    Vec_VecForEachLevelReverseStartStop( p->vMatrix, vFront, i, p->nWinTfiMax+1, 0 )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, k )
            Vec_PtrPush( p->vNodes, pObj );
        Vec_PtrClear( vFront );
    }

    // get the lowest leaf level
    p->nLevLeafMin = ABC_INFINITY;
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, k )
        p->nLevLeafMin = Abc_MinInt( p->nLevLeafMin, (int)pObj->Level );

    // set minimum traversal level
    p->nLevTravMin = Abc_MaxInt( ((int)p->pNode->Level) - p->nWinTfiMax - p->nLevTfiMinus, p->nLevLeafMin );
    assert( p->nLevTravMin >= 0 );
    return 1;
}